

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseAssembler::embedDataArray
          (BaseAssembler *this,TypeId typeId,void *data,size_t itemCount,size_t repeatCount)

{
  Logger *pLVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  Error EVar6;
  ulong uVar7;
  undefined1 *puVar8;
  size_t sVar9;
  bool bVar10;
  Error EStackY_280;
  CodeWriter writer;
  undefined8 local_258;
  ulong uStack_250;
  undefined8 local_248;
  undefined1 *local_240;
  undefined1 local_238 [520];
  
  cVar5 = (((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * '\x02' +
          '\x06';
  EVar6 = 0;
  if ((typeId & 0xfe) != _kBaseStart) {
    cVar5 = '\0';
  }
  if (0x44 < (byte)((cVar5 + typeId) - 0x20)) {
    EStackY_280 = 2;
LAB_0010e366:
    EVar6 = BaseEmitter::reportError(&this->super_BaseEmitter,EStackY_280,(char *)0x0);
    return EVar6;
  }
  if (repeatCount != 0 && itemCount != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = itemCount;
    uVar7 = SUB168(auVar2 * ZEXT116((byte)TypeUtils::_typeData
                                          [(ulong)(byte)(cVar5 + typeId) + 0x100]),0);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar7;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = repeatCount;
    if ((SUB168(auVar2 * ZEXT116((byte)TypeUtils::_typeData[(ulong)(byte)(cVar5 + typeId) + 0x100]),
                8) != 0) || (SUB168(auVar3 * auVar4,8) != 0)) {
      EStackY_280 = 1;
      goto LAB_0010e366;
    }
    writer._cursor = this->_bufferPtr;
    EVar6 = CodeWriter::ensureSpace(&writer,this,SUB168(auVar3 * auVar4,0));
    if (EVar6 == 0) {
      sVar9 = repeatCount;
      while (bVar10 = sVar9 != 0, sVar9 = sVar9 - 1, bVar10) {
        CodeWriter::emitData(&writer,data,uVar7);
      }
      CodeWriter::done(&writer,this);
      pLVar1 = (this->super_BaseEmitter)._logger;
      EVar6 = 0;
      if (pLVar1 != (Logger *)0x0) {
        local_240 = local_238;
        uStack_250 = 0;
        local_258 = 0x20;
        local_248 = 0x207;
        local_238[0] = 0;
        Formatter::formatData
                  ((String *)&local_258,(pLVar1->_options)._flags,
                   (this->super_BaseEmitter)._environment._arch,typeId,data,itemCount,repeatCount);
        String::_opChar((String *)&local_258,kAppend,'\n');
        pLVar1 = (this->super_BaseEmitter)._logger;
        uVar7 = uStack_250;
        puVar8 = local_240;
        if ((local_258 & 0xff) < 0x1f) {
          uVar7 = local_258 & 0xff;
          puVar8 = (undefined1 *)((long)&local_258 + 1);
        }
        (*pLVar1->_vptr_Logger[2])(pLVar1,puVar8,uVar7);
        String::reset((String *)&local_258);
      }
    }
  }
  return EVar6;
}

Assistant:

Error BaseAssembler::embedDataArray(TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  if (itemCount == 0 || repeatCount == 0)
    return kErrorOk;

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  size_t totalSize = Support::mulOverflow(dataSize, repeatCount, &of);

  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  CodeWriter writer(this);
  ASMJIT_PROPAGATE(writer.ensureSpace(this, totalSize));

  for (size_t i = 0; i < repeatCount; i++)
    writer.emitData(data, dataSize);

  writer.done(this);

#ifndef ASMJIT_NO_LOGGING
  if (_logger) {
    StringTmp<512> sb;
    Formatter::formatData(sb, _logger->flags(), arch(), typeId, data, itemCount, repeatCount);
    sb.append('\n');
    _logger->log(sb);
  }
#endif

  return kErrorOk;
}